

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O1

void __thiscall kj::Thread::~Thread(Thread *this)

{
  ThreadState *pTVar1;
  int iVar2;
  Fault f;
  Exception ecopy;
  Fault local_1c0;
  Exception local_1b8;
  
  if (this->detached == false) {
    iVar2 = pthread_join(this->threadId,(void **)0x0);
    if (iVar2 != 0) {
      local_1c0.exception = (Exception *)0x0;
      local_1b8.ownFile.content.ptr = (char *)0x0;
      local_1b8.ownFile.content.size_ = 0;
      _::Debug::Fault::init
                (&local_1c0,
                 (EVP_PKEY_CTX *)
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
                );
      _::Debug::Fault::~Fault(&local_1c0);
    }
    pTVar1 = this->state;
    if ((pTVar1->exception).ptr.isSet == true) {
      local_1b8.ownFile.content.ptr = (pTVar1->exception).ptr.field_1.value.ownFile.content.ptr;
      local_1b8.ownFile.content.size_ = (pTVar1->exception).ptr.field_1.value.ownFile.content.size_;
      local_1b8.ownFile.content.disposer =
           (pTVar1->exception).ptr.field_1.value.ownFile.content.disposer;
      (pTVar1->exception).ptr.field_1.value.ownFile.content.ptr = (char *)0x0;
      (pTVar1->exception).ptr.field_1.value.ownFile.content.size_ = 0;
      local_1b8.file = (pTVar1->exception).ptr.field_1.value.file;
      local_1b8._32_8_ = *(undefined8 *)((long)&(pTVar1->exception).ptr.field_1 + 0x20);
      local_1b8.description.content.ptr =
           (pTVar1->exception).ptr.field_1.value.description.content.ptr;
      local_1b8.description.content.size_ =
           (pTVar1->exception).ptr.field_1.value.description.content.size_;
      local_1b8.description.content.disposer =
           (pTVar1->exception).ptr.field_1.value.description.content.disposer;
      (pTVar1->exception).ptr.field_1.value.description.content.ptr = (char *)0x0;
      (pTVar1->exception).ptr.field_1.value.description.content.size_ = 0;
      local_1b8.context.ptr.disposer = (pTVar1->exception).ptr.field_1.value.context.ptr.disposer;
      local_1b8.context.ptr.ptr = (pTVar1->exception).ptr.field_1.value.context.ptr.ptr;
      (pTVar1->exception).ptr.field_1.value.context.ptr.ptr = (Context *)0x0;
      local_1b8.remoteTrace.content.ptr =
           (pTVar1->exception).ptr.field_1.value.remoteTrace.content.ptr;
      local_1b8.remoteTrace.content.size_ =
           (pTVar1->exception).ptr.field_1.value.remoteTrace.content.size_;
      local_1b8.remoteTrace.content.disposer =
           (pTVar1->exception).ptr.field_1.value.remoteTrace.content.disposer;
      (pTVar1->exception).ptr.field_1.value.remoteTrace.content.ptr = (char *)0x0;
      (pTVar1->exception).ptr.field_1.value.remoteTrace.content.size_ = 0;
      memcpy(local_1b8.trace,(void *)((long)&(pTVar1->exception).ptr.field_1 + 0x68),0x105);
      local_1b8.details.builder.ptr = (pTVar1->exception).ptr.field_1.value.details.builder.ptr;
      local_1b8.details.builder.pos = (pTVar1->exception).ptr.field_1.value.details.builder.pos;
      local_1b8.details.builder.endPtr =
           (pTVar1->exception).ptr.field_1.value.details.builder.endPtr;
      local_1b8.details.builder.disposer =
           (pTVar1->exception).ptr.field_1.value.details.builder.disposer;
      (pTVar1->exception).ptr.field_1.value.details.builder.endPtr = (Detail *)0x0;
      (pTVar1->exception).ptr.field_1.value.details.builder.ptr = (Detail *)0x0;
      (pTVar1->exception).ptr.field_1.value.details.builder.pos =
           (RemoveConst<kj::Exception::Detail> *)0x0;
      pTVar1 = this->state;
      if ((pTVar1->exception).ptr.isSet == true) {
        (pTVar1->exception).ptr.isSet = false;
        Exception::~Exception(&(pTVar1->exception).ptr.field_1.value);
      }
      throwRecoverableException(&local_1b8,0);
      Exception::~Exception(&local_1b8);
    }
    ThreadState::unref(this->state);
  }
  return;
}

Assistant:

Thread::~Thread() noexcept(false) {
  if (!detached) {
    KJ_DEFER(state->unref());

    int pthreadResult = pthread_join(*reinterpret_cast<pthread_t*>(&threadId), nullptr);
    if (pthreadResult != 0) {
      KJ_FAIL_SYSCALL("pthread_join", pthreadResult) { break; }
    }

    KJ_IF_SOME(e, state->exception) {
      Exception ecopy = kj::mv(e);
      state->exception = kj::none;  // don't complain of uncaught exception when deleting
      kj::throwRecoverableException(kj::mv(ecopy));
    }
  }
}